

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O3

uint aom_highbd_avg_4x4_c(uint8_t *s8,int p)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  int iVar6;
  ulong *puVar7;
  int iVar8;
  
  puVar7 = (ulong *)((long)s8 * 2);
  iVar8 = 0;
  iVar6 = 4;
  do {
    uVar1 = *puVar7;
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar1;
    auVar2._12_2_ = (short)(uVar1 >> 0x30);
    auVar3._8_2_ = (short)(uVar1 >> 0x20);
    auVar3._0_8_ = uVar1;
    auVar3._10_4_ = auVar2._10_4_;
    auVar5._6_8_ = 0;
    auVar5._0_6_ = auVar3._8_6_;
    auVar4._4_2_ = (short)(uVar1 >> 0x10);
    auVar4._0_4_ = (uint)uVar1;
    auVar4._6_8_ = SUB148(auVar5 << 0x40,6);
    iVar8 = (auVar2._10_4_ >> 0x10) + auVar4._4_4_ + auVar3._8_4_ + ((uint)uVar1 & 0xffff) + iVar8;
    puVar7 = (ulong *)((long)puVar7 + (long)p * 2);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return iVar8 + 8 >> 4;
}

Assistant:

unsigned int aom_highbd_avg_4x4_c(const uint8_t *s8, int p) {
  int i, j;
  int sum = 0;
  const uint16_t *s = CONVERT_TO_SHORTPTR(s8);
  for (i = 0; i < 4; ++i, s += p)
    for (j = 0; j < 4; sum += s[j], ++j) {
    }

  return (sum + 8) >> 4;
}